

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdx86_decoder.c
# Opt level: O0

ND_UINT8 NdGetCompDispSize(INSTRUX *Instrux,ND_UINT32 MemSize)

{
  ND_UINT32 MemSize_local;
  INSTRUX *Instrux_local;
  
  Instrux_local._7_1_ = (ND_UINT8)MemSize;
  if ((*(uint *)&Instrux->field_0x5 >> 0x16 & 1) == 0) {
    switch(Instrux->TupleType) {
    case '\x01':
      Instrux_local._7_1_ = "\x10 @"[(uint)Instrux->Exs >> 0xe & 3];
      break;
    case '\x02':
      Instrux_local._7_1_ = "\b\x10 "[(uint)Instrux->Exs >> 0xe & 3];
      break;
    case '\x03':
      Instrux_local._7_1_ = "\x04\b\x10"[(uint)Instrux->Exs >> 0xe & 3];
      break;
    case '\x04':
      Instrux_local._7_1_ = '\x01';
      break;
    case '\x05':
      Instrux_local._7_1_ = '\x02';
      break;
    case '\x06':
      if ((Instrux->Attributes & 0x400) == 0) {
        Instrux_local._7_1_ = '\x04';
        if (((uint)Instrux->Exs & 1) != 0) {
          Instrux_local._7_1_ = '\b';
        }
      }
      else {
        Instrux_local._7_1_ = '\x04';
      }
      break;
    case '\a':
      break;
    case '\b':
      Instrux_local._7_1_ = '\b';
      if (((uint)Instrux->Exs & 1) != 0) {
        Instrux_local._7_1_ = '\x10';
      }
      break;
    case '\t':
      Instrux_local._7_1_ = '\x10';
      if (((uint)Instrux->Exs & 1) != 0) {
        Instrux_local._7_1_ = ' ';
      }
      break;
    case '\n':
      Instrux_local._7_1_ = ' ';
      break;
    case '\v':
      Instrux_local._7_1_ = "\x10 @"[(uint)Instrux->Exs >> 0xe & 3];
      break;
    case '\f':
      Instrux_local._7_1_ = "\b\x10 "[(uint)Instrux->Exs >> 0xe & 3];
      break;
    case '\r':
      Instrux_local._7_1_ = "\x04\b\x10"[(uint)Instrux->Exs >> 0xe & 3];
      break;
    case '\x0e':
      Instrux_local._7_1_ = "\x02\x04\b"[(uint)Instrux->Exs >> 0xe & 3];
      break;
    case '\x0f':
      Instrux_local._7_1_ = '\x10';
      break;
    case '\x10':
      Instrux_local._7_1_ = "\b @"[(uint)Instrux->Exs >> 0xe & 3];
      break;
    case '\x11':
      Instrux_local._7_1_ = '\x10';
      break;
    default:
      Instrux_local._7_1_ = '\x01';
    }
  }
  return Instrux_local._7_1_;
}

Assistant:

static ND_UINT8
NdGetCompDispSize(
    const INSTRUX *Instrux,
    ND_UINT32 MemSize
    )
{
    static const ND_UINT8 fvszLut[4] = { 16, 32, 64, 0 };
    static const ND_UINT8 hvszLut[4] = { 8, 16, 32, 0 };
    static const ND_UINT8 qvszLut[4] = { 4, 8, 16, 0 };
    static const ND_UINT8 dupszLut[4] = { 8, 32, 64, 0 };
    static const ND_UINT8 fvmszLut[4] = { 16, 32, 64, 0 };
    static const ND_UINT8 hvmszLut[4] = { 8, 16, 32, 0 };
    static const ND_UINT8 qvmszLut[4] = { 4, 8, 16, 0 };
    static const ND_UINT8 ovmszLut[4] = { 2, 4, 8, 0 };

    if (Instrux->HasBroadcast)
    {
        // If the instruction uses broadcast, then compressed displacement will use the size of the element as scale:
        // - 2 when broadcasting 16 bit
        // - 4 when broadcasting 32 bit
        // - 8 when broadcasting 64 bit
        return (ND_UINT8)MemSize;
    }

    switch (Instrux->TupleType)
    {
    case ND_TUPLE_FV:
        return fvszLut[Instrux->Exs.l];
    case ND_TUPLE_HV:
        return hvszLut[Instrux->Exs.l];
    case ND_TUPLE_QV:
        return qvszLut[Instrux->Exs.l];
    case ND_TUPLE_DUP:
        return dupszLut[Instrux->Exs.l];
    case ND_TUPLE_FVM:
        return fvmszLut[Instrux->Exs.l];
    case ND_TUPLE_HVM:
        return hvmszLut[Instrux->Exs.l];
    case ND_TUPLE_QVM:
        return qvmszLut[Instrux->Exs.l];
    case ND_TUPLE_OVM:
        return ovmszLut[Instrux->Exs.l];
    case ND_TUPLE_M128:
        return 16;
    case ND_TUPLE_T1S8:
        return 1;
    case ND_TUPLE_T1S16:
        return 2;
    case ND_TUPLE_T1S:
        return !!(Instrux->Attributes & ND_FLAG_WIG) ? 4 : Instrux->Exs.w ? 8 : 4;
    case ND_TUPLE_T1F:
        return (ND_UINT8)MemSize;
    case ND_TUPLE_T2:
        return Instrux->Exs.w ? 16 : 8;
    case ND_TUPLE_T4:
        return Instrux->Exs.w ? 32 : 16;
    case ND_TUPLE_T8:
        return 32;
    case ND_TUPLE_T1_4X:
        return 16;
    default:
        // Default - we assume byte granularity for memory accesses, therefore, no scaling will be done.
        return 1;
    }
}